

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

string * __thiscall
pstack::Context::linkResolve(string *__return_storage_ptr__,Context *this,string *name)

{
  char *__path;
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  allocator<char> local_4d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  byte local_4b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  byte local_48a;
  allocator<char> local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  size_type local_468;
  size_type lastSlash;
  int local_44c;
  undefined1 local_448 [4];
  int rc;
  string orig;
  char buf [1024];
  string *name_local;
  Context *this_local;
  
  std::__cxx11::string::string((string *)local_448,name);
  while( true ) {
    __path = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (name);
    sVar1 = readlink(__path,orig.field_2._M_local_buf + 8,0x3ff);
    local_44c = (int)sVar1;
    if (local_44c == -1) break;
    buf[(long)local_44c + -8] = '\0';
    if (orig.field_2._M_local_buf[8] == '/') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,orig.field_2._M_local_buf + 8);
    }
    else {
      local_468 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind(name,'/',0xffffffffffffffff);
      local_48a = 0;
      local_4b1 = 0;
      bVar3 = local_468 != 0xffffffffffffffff;
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_4b0,name,0,local_468 + 1);
        local_4b1 = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4d8,orig.field_2._M_local_buf + 8,&local_4d9);
        std::operator+(&local_488,&local_4b0,&local_4d8);
      }
      else {
        std::allocator<char>::allocator();
        local_48a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,orig.field_2._M_local_buf + 8,&local_489);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,&local_488);
      std::__cxx11::string::~string((string *)&local_488);
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_4d8);
        std::allocator<char>::~allocator(&local_4d9);
      }
      if ((local_4b1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4b0);
      }
      if ((local_48a & 1) != 0) {
        std::allocator<char>::~allocator(&local_489);
      }
    }
  }
  piVar2 = __errno_location();
  local_500 = name;
  if (*piVar2 != 0x16) {
    local_500 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_500);
  std::__cxx11::string::~string((string *)local_448);
  return __return_storage_ptr__;
}

Assistant:

std::string
Context::linkResolve(std::string name)
{
    char buf[1024];
    std::string orig = name;
    int rc;
    for (;;) {
        rc = readlink(name.c_str(), buf, sizeof buf - 1);
        // some files in /proc are links, but report "(deleted)" in the name if
        // the original has gone away. Opening such files works, and uses the
        // in-core inode, so use that if we can
        if (rc == -1) {
            return errno == EINVAL ? name : orig;
        }
        buf[rc] = 0;
        if (buf[0] != '/') {
            auto lastSlash = name.rfind('/');
            name = lastSlash == std::string::npos
               ? std::string(buf)
               : name.substr(0, lastSlash + 1) + std::string(buf);
        } else {
            name = buf;
        }
    }
    return name;
}